

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O2

void __thiscall
Debugger::GetVariable
          (Debugger *this,lua_State *L,Idx<Variable> variable,int index,int depth,bool queryHelper)

{
  bool bVar1;
  int valueIndex;
  int iVar2;
  uint uVar3;
  int depth_00;
  int iVar4;
  char *pcVar5;
  Variable *pVVar6;
  ostream *poVar7;
  ulong __position;
  lua_Number __val;
  double dVar8;
  Idx<Variable> IVar9;
  Idx<Variable> variable_00;
  Idx<Variable> variable_01;
  Idx<Variable> variable_02;
  Idx<Variable> variable_03;
  Idx<Variable> variable_04;
  Idx<Variable> variable_05;
  Idx<Variable> variable_06;
  Idx<Variable> variable_local;
  Idx<Variable> v;
  stringstream ss;
  ostream local_1a8 [376];
  
  IVar9._arena = variable._arena;
  IVar9.Raw = variable.Raw;
  if (L == (lua_State *)0x0) {
    L = this->currentL;
  }
  if (depth < 1 || L == (lua_State *)0x0) {
    return;
  }
  variable_local.Raw = IVar9.Raw;
  variable_local._arena = IVar9._arena;
  valueIndex = (*lua_gettop)(L);
  iVar2 = lua_absindex(L,index);
  IVar9._4_4_ = 0;
  CacheValue(this,iVar2,IVar9);
  uVar3 = (*lua_type)(L,iVar2);
  pcVar5 = (*lua_typename)(L,uVar3);
  pVVar6 = Idx<Variable>::operator->(&variable_local);
  std::__cxx11::string::assign((char *)&pVVar6->valueTypeName);
  pVVar6 = Idx<Variable>::operator->(&variable_local);
  pVVar6->valueType = uVar3;
  __position = (ulong)uVar3;
  if (queryHelper) {
    if ((((uVar3 < 9) && (this->displayCustomTypeInfo != false)) &&
        (bVar1 = std::bitset<9UL>::test(&this->registeredTypes,__position), bVar1)) &&
       (variable_00._4_4_ = 0, variable_00.Raw = variable_local.Raw,
       variable_00._arena = variable_local._arena,
       bVar1 = ExtensionPoint::QueryVariableCustom
                         (&this->manager->extension,L,variable_00,pcVar5,iVar2,depth), bVar1)) {
      return;
    }
    switch(__position) {
    case 0:
      goto switchD_00155d97_caseD_0;
    case 1:
      goto switchD_00155d97_caseD_1;
    case 2:
    case 8:
      goto switchD_00155d97_caseD_2;
    case 3:
    case 4:
      goto switchD_00155d97_caseD_3;
    case 5:
    case 6:
    case 7:
      variable_01._4_4_ = 0;
      variable_01.Raw = variable_local.Raw;
      variable_01._arena = variable_local._arena;
      bVar1 = ExtensionPoint::QueryVariable
                        (&this->manager->extension,L,variable_01,pcVar5,iVar2,depth);
      if (bVar1) {
        return;
      }
      break;
    default:
      goto switchD_00155d97_default;
    }
  }
  switch(__position) {
  case 0:
    goto switchD_00155d97_caseD_0;
  case 1:
switchD_00155d97_caseD_1:
    (*lua_toboolean)(L,iVar2);
    goto LAB_00155e6a;
  case 2:
  case 8:
switchD_00155d97_caseD_2:
    ToPointer_abi_cxx11_((string *)&ss,L,iVar2);
    pVVar6 = Idx<Variable>::operator->(&variable_local);
    std::__cxx11::string::operator=((string *)&pVVar6->value,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    break;
  case 3:
  case 4:
switchD_00155d97_caseD_3:
    (*lua_tolstring)(L,iVar2,(size_t *)0x0);
LAB_00155e6a:
    pVVar6 = Idx<Variable>::operator->(&variable_local);
LAB_00155e7b:
    std::__cxx11::string::assign((char *)&pVVar6->value);
    break;
  case 5:
    (*lua_topointer)(L,iVar2);
    (*lua_pushnil)(L);
    depth_00 = depth + -1;
    while (iVar4 = (*lua_next)(L,iVar2), iVar4 != 0) {
      if (1 < (uint)depth) {
        IVar9 = Arena<Variable>::Alloc(variable_local._arena);
        v._arena = IVar9._arena;
        v.Raw = IVar9.Raw;
        iVar4 = (*lua_type)(L,-2);
        pVVar6 = Idx<Variable>::operator->(&v);
        pVVar6->nameType = iVar4;
        if (iVar4 == 1) {
          (*lua_toboolean)(L,-2);
LAB_00155fe2:
          pVVar6 = Idx<Variable>::operator->(&v);
          std::__cxx11::string::assign((char *)&pVVar6->name);
        }
        else if (iVar4 == 3) {
          __val = lua_tonumber(L,-2);
          dVar8 = (double)(long)__val;
          if ((__val != dVar8) || (NAN(__val) || NAN(dVar8))) {
            std::__cxx11::to_string((string *)&ss,__val);
            pVVar6 = Idx<Variable>::operator->(&v);
          }
          else {
            std::__cxx11::to_string((string *)&ss,(long)__val);
            pVVar6 = Idx<Variable>::operator->(&v);
          }
          std::__cxx11::string::operator=((string *)&pVVar6->name,(string *)&ss);
          std::__cxx11::string::~string((string *)&ss);
        }
        else {
          if (iVar4 == 4) {
            (*lua_tolstring)(L,-2,(size_t *)0x0);
            goto LAB_00155fe2;
          }
          ToPointer_abi_cxx11_((string *)&ss,L,-2);
          pVVar6 = Idx<Variable>::operator->(&v);
          std::__cxx11::string::operator=((string *)&pVVar6->name,(string *)&ss);
          std::__cxx11::string::~string((string *)&ss);
        }
        variable_02._4_4_ = 0;
        variable_02.Raw = v.Raw;
        variable_02._arena = v._arena;
        GetVariable(this,L,variable_02,-1,depth_00,true);
        pVVar6 = Idx<Variable>::operator->(&variable_local);
        std::vector<Idx<Variable>,_std::allocator<Idx<Variable>_>_>::push_back(&pVVar6->children,&v)
        ;
      }
      (*lua_settop)(L,-2);
    }
    iVar2 = (*lua_getmetatable)(L,iVar2);
    if (iVar2 != 0) {
      IVar9 = Arena<Variable>::Alloc(variable_local._arena);
      _ss = IVar9.Raw;
      pVVar6 = Idx<Variable>::operator->((Idx<Variable> *)&ss);
      std::__cxx11::string::assign((char *)&pVVar6->name);
      iVar2 = (*lua_type)(L,-1);
      pVVar6 = Idx<Variable>::operator->((Idx<Variable> *)&ss);
      pVVar6->nameType = iVar2;
      variable_03._4_4_ = 0;
      variable_03.Raw = _ss;
      variable_03._arena = IVar9._arena;
      GetVariable(this,L,variable_03,-1,depth_00,true);
      pVVar6 = Idx<Variable>::operator->(&variable_local);
      std::vector<Idx<Variable>,_std::allocator<Idx<Variable>_>_>::push_back
                (&pVVar6->children,(Idx<Variable> *)&ss);
      iVar2 = (*lua_type)(L,-1);
      if (iVar2 == 5) {
        (*lua_pushstring)(L,"__index");
        (*lua_rawget)(L,-2);
        iVar2 = (*lua_type)(L,-1);
        if (iVar2 != 0) {
          IVar9 = Arena<Variable>::Alloc(variable_local._arena);
          v._arena = IVar9._arena;
          v.Raw = IVar9.Raw;
          pVVar6 = Idx<Variable>::operator->(&v);
          std::__cxx11::string::assign((char *)&pVVar6->name);
          iVar2 = (*lua_type)(L,-1);
          pVVar6 = Idx<Variable>::operator->(&v);
          pVVar6->nameType = iVar2;
          variable_04._4_4_ = 0;
          variable_04.Raw = v.Raw;
          variable_04._arena = v._arena;
          GetVariable(this,L,variable_04,-1,depth_00,true);
          pVVar6 = Idx<Variable>::operator->(&variable_local);
          std::vector<Idx<Variable>,_std::allocator<Idx<Variable>_>_>::push_back
                    (&pVVar6->children,&v);
        }
        (*lua_settop)(L,-2);
      }
      (*lua_settop)(L,-2);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar7 = std::operator<<(local_1a8,"table(0x");
    *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
         *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar7 = std::ostream::_M_insert<void_const*>(poVar7);
    *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
         *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar7 = std::operator<<(poVar7,", size = ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::operator<<(poVar7,")");
    std::__cxx11::stringbuf::str();
    pVVar6 = Idx<Variable>::operator->(&variable_local);
    std::__cxx11::string::operator=((string *)&pVVar6->value,(string *)&v);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    break;
  case 6:
    variable_06._4_4_ = 0;
    variable_06.Raw = variable_local.Raw;
    variable_06._arena = variable_local._arena;
    DisplayFunction(variable_06,L,iVar2);
    break;
  case 7:
    pcVar5 = (*lua_tolstring)(L,iVar2,(size_t *)0x0);
    if (pcVar5 == (char *)0x0) {
      bVar1 = CallMetaFunction(L,valueIndex,"__tostring",1,(int *)&ss);
      if ((bVar1) && (_ss == 0)) {
        pcVar5 = (*lua_tolstring)(L,-1,(size_t *)0x0);
        (*lua_settop)(L,-2);
        if (pcVar5 != (char *)0x0) goto LAB_001560e4;
      }
      ToPointer_abi_cxx11_((string *)&ss,L,iVar2);
      pVVar6 = Idx<Variable>::operator->(&variable_local);
      std::__cxx11::string::operator=((string *)&pVVar6->value,(string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
    }
    else {
LAB_001560e4:
      pVVar6 = Idx<Variable>::operator->(&variable_local);
      std::__cxx11::string::assign((char *)&pVVar6->value);
    }
    if ((1 < (uint)depth) && (iVar2 = (*lua_getmetatable)(L,iVar2), iVar2 != 0)) {
      variable_05._4_4_ = 0;
      variable_05.Raw = variable_local.Raw;
      variable_05._arena = variable_local._arena;
      GetVariable(this,L,variable_05,-1,depth,true);
      (*lua_settop)(L,-2);
    }
  }
switchD_00155d97_default:
  iVar2 = (*lua_gettop)(L);
  if (iVar2 == valueIndex) {
    return;
  }
  __assert_fail("t2 == topIndex",
                "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/emmy_debugger/src/debugger/emmy_debugger.cpp"
                ,0x208,"void Debugger::GetVariable(lua_State *, Idx<Variable>, int, int, bool)");
switchD_00155d97_caseD_0:
  pVVar6 = Idx<Variable>::operator->(&variable_local);
  goto LAB_00155e7b;
}

Assistant:

void Debugger::GetVariable(lua_State *L, Idx<Variable> variable, int index, int depth, bool queryHelper) {
	if (!L) {
		L = currentL;
	}

	if (!L) {
		return;
	}

	// 如果没有计算深度则不予计算
	if (depth <= 0) {
		return;
	}

	const int topIndex = lua_gettop(L);
	index = lua_absindex(L, index);
	CacheValue(index, variable);
	const int type = lua_type(L, index);
	const char *typeName = lua_typename(L, type);
	variable->valueTypeName = typeName;
	variable->valueType = type;

	if (queryHelper) {
		if (displayCustomTypeInfo && type >= 0 && type < registeredTypes.size() && registeredTypes.test(type)
			&& manager->extension.QueryVariableCustom(L, variable, typeName, index, depth)) {
			return;
		}
		else if ((type == LUA_TTABLE || type == LUA_TUSERDATA || type == LUA_TFUNCTION)
			&& manager->extension.QueryVariable(L, variable, typeName, index, depth)) {
			return;
		}
	}
	switch (type) {
		case LUA_TNIL: {
			variable->value = "nil";
			break;
		}
		case LUA_TNUMBER: {
			variable->value = lua_tostring(L, index);
			break;
		}
		case LUA_TBOOLEAN: {
			const bool v = lua_toboolean(L, index);
			variable->value = v ? "true" : "false";
			break;
		}
		case LUA_TSTRING: {
			variable->value = lua_tostring(L, index);
			break;
		}
		case LUA_TUSERDATA: {
			auto *string = lua_tostring(L, index);
			if (string == nullptr) {
				int result;
				if (CallMetaFunction(L, topIndex, "__tostring", 1, result) && result == 0) {
					string = lua_tostring(L, -1);
					lua_pop(L, 1);
				}
			}
			if (string) {
				variable->value = string;
			} else {
				variable->value = ToPointer(L, index);
			}
			if (depth > 1) {
				if (lua_getmetatable(L, index)) {
					GetVariable(L, variable, -1, depth);
					lua_pop(L, 1);//pop meta
				}
			}
			break;
		}
		case LUA_TFUNCTION: {
#ifndef EMMY_USE_LUA_SOURCE
			DisplayFunction(variable, L, index);
#else
			variable->value = ToPointer(L, index);
#endif

			break;
		}
		case LUA_TLIGHTUSERDATA:
		case LUA_TTHREAD: {
			variable->value = ToPointer(L, index);
			break;
		}
		case LUA_TTABLE: {
			std::size_t tableSize = 0;
			const void *tableAddr = lua_topointer(L, index);
			lua_pushnil(L);
			while (lua_next(L, index)) {
				// k: -2, v: -1
				if (depth > 1) {
					//todo: use allocator
					auto v = variable.GetArena()->Alloc();
					const auto t = lua_type(L, -2);
					v->nameType = t;
                    switch (t) {
                        case LUA_TSTRING:
                        {
                            v->name = lua_tostring(L, -2);
                            break;
                        }
                        case LUA_TNUMBER:
                        {
                            auto number = lua_tonumber(L, -2);
                            if (static_cast<long long>(number) == number) {
                                v->name = std::to_string(static_cast<long long>(number));
                            } else {
                                v->name = std::to_string(number);
                            }
                            break;
                        }
                        case LUA_TBOOLEAN:
                        {
                            v->name = lua_toboolean(L, -2) ? "true" : "false";
                            break;
                        }
                        default: {
                            v->name = ToPointer(L, -2);
                            break;
                        }
                    }

					GetVariable(L, v, -1, depth - 1);
					variable->children.push_back(v);
				}
				lua_pop(L, 1);
				tableSize++;
			}


			if (lua_getmetatable(L, index)) {
				// metatable
				auto metatable = variable.GetArena()->Alloc();
				metatable->name = "(metatable)";
				metatable->nameType = lua_type(L, -1);

				GetVariable(L, metatable, -1, depth - 1);
				variable->children.push_back(metatable);

				//__index
				if (lua_istable(L, -1)) {
					// fix BUG 导致涉及到FGUI的框架崩溃
					lua_pushstring(L, "__index");
					lua_rawget(L, -2);
					if (!lua_isnil(L, -1)) {
						auto v = variable.GetArena()->Alloc();
						v->name = "(metatable.__index)";
						v->nameType = lua_type(L, -1);
						GetVariable(L, v, -1, depth - 1);
						variable->children.push_back(v);
					}
					lua_pop(L, 1);
				}

				// metatable
				lua_pop(L, 1);
			}

			std::stringstream ss;
			ss << "table(0x" << std::hex << tableAddr << std::dec << ", size = " << tableSize << ")";
			variable->value = ss.str();
			break;
		}
	}
	const int t2 = lua_gettop(L);
	assert(t2 == topIndex);
}